

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

AnalyserVariablePtr __thiscall
libcellml::Generator::GeneratorImpl::analyserVariable(GeneratorImpl *this,VariablePtr *variable)

{
  element_type *peVar1;
  bool bVar2;
  VariablePtr *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  pointer psVar4;
  AnalyserVariablePtr AVar5;
  VariablePtr modelVoiVariable;
  vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
  modelVariables;
  AnalyserVariablePtr modelVoi;
  VariablePtr local_78;
  VariablePtr local_68;
  vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
  local_58;
  AnalyserModel local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  (this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AnalyserModel::voi(&local_40);
  if (local_40.mPimpl == (AnalyserModelImpl *)0x0) {
    local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    AnalyserVariable::variable((AnalyserVariable *)local_40.mPimpl);
  }
  if ((local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     (bVar2 = AnalyserModel::areEquivalentVariables
                        ((AnalyserModel *)
                         (variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         ,in_RDX,&local_78), !bVar2)) {
    AnalyserModel::states
              (&local_58,
               (AnalyserModel *)
               (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    if (local_58.
        super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar4 = local_58.
               super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        peVar1 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        AnalyserVariable::variable
                  ((psVar4->
                   super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
        bVar2 = AnalyserModel::areEquivalentVariables((AnalyserModel *)peVar1,in_RDX,&local_68);
        if (local_68.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar2) {
          (this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)
                   (psVar4->
                   super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(this->mModel).
                      super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(psVar4->
                      super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          break;
        }
        psVar4 = psVar4 + 1;
      } while (psVar4 != local_58.
                         super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
    ::~vector(&local_58);
    _Var3._M_pi = extraout_RDX_00;
    if ((this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      AnalyserModel::variables
                (&local_58,
                 (AnalyserModel *)
                 (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      psVar4 = local_58.
               super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        peVar1 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        AnalyserVariable::variable
                  ((psVar4->
                   super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
        bVar2 = AnalyserModel::areEquivalentVariables((AnalyserModel *)peVar1,in_RDX,&local_68);
        if (local_68.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar2) {
          (this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)
                   (psVar4->
                   super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(this->mModel).
                      super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(psVar4->
                      super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
        }
        else {
          psVar4 = psVar4 + 1;
        }
      } while ((this->mModel).
               super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
               (element_type *)0x0);
      std::
      vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
      ::~vector(&local_58);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  else {
    (this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40.mPimpl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->mModel).
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&local_38);
    _Var3._M_pi = extraout_RDX;
  }
  if (local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_02;
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    _Var3._M_pi = extraout_RDX_03;
  }
  AVar5.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  AVar5.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnalyserVariablePtr)
         AVar5.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnalyserVariablePtr Generator::GeneratorImpl::analyserVariable(const VariablePtr &variable) const
{
    // Find and return the analyser variable associated with the given variable.

    AnalyserVariablePtr res;
    auto modelVoi = mModel->voi();
    VariablePtr modelVoiVariable = (modelVoi != nullptr) ? modelVoi->variable() : nullptr;

    if ((modelVoiVariable != nullptr)
        && mModel->areEquivalentVariables(variable, modelVoiVariable)) {
        res = modelVoi;
    } else {
        for (const auto &modelState : mModel->states()) {
            if (mModel->areEquivalentVariables(variable, modelState->variable())) {
                res = modelState;

                break;
            }
        }

        if (res == nullptr) {
            // Normally, we would have:
            //
            //     for (const auto &modelVariable : mModel->variables()) {
            //         if (mModel->areEquivalentVariables(variable, modelVariable->variable())) {
            //             res = modelVariable;
            //
            //             break;
            //         }
            //     }
            //
            // but we always have variables, so llvm-cov will complain that the
            // false branch of our for loop is never reached. The below code is
            // a bit more verbose but at least it makes llvm-cov happy.

            auto modelVariables = mModel->variables();
            auto modelVariable = modelVariables.begin();

            do {
                if (mModel->areEquivalentVariables(variable, (*modelVariable)->variable())) {
                    res = *modelVariable;
                } else {
                    ++modelVariable;
                }
            } while (res == nullptr);
        }
    }

    return res;
}